

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * removeUnindexableInClauseTerms(Parse *pParse,int iEq,WhereLoop *pLoop,Expr *pX)

{
  sqlite3 *db_00;
  ExprList *pEVar1;
  ExprList *pList;
  Expr *pEVar2;
  int iVar3;
  Expr *pEVar4;
  ExprList *pOrderBy;
  Expr *p;
  int iField;
  Select *pSelect;
  ExprList *pEStack_58;
  int i;
  ExprList *pLhs;
  ExprList *pRhs;
  ExprList *pOrigLhs;
  ExprList *pOrigRhs;
  Expr *pNew;
  sqlite3 *db;
  Expr *pX_local;
  WhereLoop *pLoop_local;
  int iEq_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pEVar4 = sqlite3ExprDup(db_00,pX,0);
  if (db_00->mallocFailed == '\0') {
    pEVar1 = ((pEVar4->x).pSelect)->pEList;
    pList = (pEVar4->pLeft->x).pList;
    pLhs = (ExprList *)0x0;
    pEStack_58 = (ExprList *)0x0;
    for (pSelect._4_4_ = iEq; pSelect._4_4_ < (int)(uint)pLoop->nLTerm;
        pSelect._4_4_ = pSelect._4_4_ + 1) {
      if ((pLoop->aLTerm[pSelect._4_4_]->pExpr == pX) &&
         (iVar3 = pLoop->aLTerm[pSelect._4_4_]->iField + -1, pEVar1->a[iVar3].pExpr != (Expr *)0x0))
      {
        pLhs = sqlite3ExprListAppend(pParse,pLhs,pEVar1->a[iVar3].pExpr);
        pEVar1->a[iVar3].pExpr = (Expr *)0x0;
        pEStack_58 = sqlite3ExprListAppend(pParse,pEStack_58,pList->a[iVar3].pExpr);
        pList->a[iVar3].pExpr = (Expr *)0x0;
      }
    }
    sqlite3ExprListDelete(db_00,pEVar1);
    sqlite3ExprListDelete(db_00,pList);
    (pEVar4->pLeft->x).pList = pEStack_58;
    ((pEVar4->x).pSelect)->pEList = pLhs;
    if ((pEStack_58 != (ExprList *)0x0) && (pEStack_58->nExpr == 1)) {
      pEVar2 = pEStack_58->a[0].pExpr;
      pEStack_58->a[0].pExpr = (Expr *)0x0;
      sqlite3ExprDelete(db_00,pEVar4->pLeft);
      pEVar4->pLeft = pEVar2;
    }
    if (((pEVar4->x).pSelect)->pOrderBy != (ExprList *)0x0) {
      pEVar1 = ((pEVar4->x).pSelect)->pOrderBy;
      for (pSelect._4_4_ = 0; pSelect._4_4_ < pEVar1->nExpr; pSelect._4_4_ = pSelect._4_4_ + 1) {
        pEVar1->a[pSelect._4_4_].u.x.iOrderByCol = 0;
      }
    }
  }
  return pEVar4;
}

Assistant:

static Expr *removeUnindexableInClauseTerms(
  Parse *pParse,        /* The parsing context */
  int iEq,              /* Look at loop terms starting here */
  WhereLoop *pLoop,     /* The current loop */
  Expr *pX              /* The IN expression to be reduced */
){
  sqlite3 *db = pParse->db;
  Expr *pNew = sqlite3ExprDup(db, pX, 0);
  if( db->mallocFailed==0 ){
    ExprList *pOrigRhs = pNew->x.pSelect->pEList;  /* Original unmodified RHS */
    ExprList *pOrigLhs = pNew->pLeft->x.pList;     /* Original unmodified LHS */
    ExprList *pRhs = 0;         /* New RHS after modifications */
    ExprList *pLhs = 0;         /* New LHS after mods */
    int i;                      /* Loop counter */
    Select *pSelect;            /* Pointer to the SELECT on the RHS */

    for(i=iEq; i<pLoop->nLTerm; i++){
      if( pLoop->aLTerm[i]->pExpr==pX ){
        int iField = pLoop->aLTerm[i]->iField - 1;
        if( pOrigRhs->a[iField].pExpr==0 ) continue; /* Duplicate PK column */
        pRhs = sqlite3ExprListAppend(pParse, pRhs, pOrigRhs->a[iField].pExpr);
        pOrigRhs->a[iField].pExpr = 0;
        assert( pOrigLhs->a[iField].pExpr!=0 );
        pLhs = sqlite3ExprListAppend(pParse, pLhs, pOrigLhs->a[iField].pExpr);
        pOrigLhs->a[iField].pExpr = 0;
      }
    }
    sqlite3ExprListDelete(db, pOrigRhs);
    sqlite3ExprListDelete(db, pOrigLhs);
    pNew->pLeft->x.pList = pLhs;
    pNew->x.pSelect->pEList = pRhs;
    if( pLhs && pLhs->nExpr==1 ){
      /* Take care here not to generate a TK_VECTOR containing only a
      ** single value. Since the parser never creates such a vector, some
      ** of the subroutines do not handle this case.  */
      Expr *p = pLhs->a[0].pExpr;
      pLhs->a[0].pExpr = 0;
      sqlite3ExprDelete(db, pNew->pLeft);
      pNew->pLeft = p;
    }
    pSelect = pNew->x.pSelect;
    if( pSelect->pOrderBy ){
      /* If the SELECT statement has an ORDER BY clause, zero the 
      ** iOrderByCol variables. These are set to non-zero when an 
      ** ORDER BY term exactly matches one of the terms of the 
      ** result-set. Since the result-set of the SELECT statement may
      ** have been modified or reordered, these variables are no longer 
      ** set correctly.  Since setting them is just an optimization, 
      ** it's easiest just to zero them here.  */
      ExprList *pOrderBy = pSelect->pOrderBy;
      for(i=0; i<pOrderBy->nExpr; i++){
        pOrderBy->a[i].u.x.iOrderByCol = 0;
      }
    }

#if 0
    printf("For indexing, change the IN expr:\n");
    sqlite3TreeViewExpr(0, pX, 0);
    printf("Into:\n");
    sqlite3TreeViewExpr(0, pNew, 0);
#endif
  }
  return pNew;
}